

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

int __thiscall
FOptionMenuItemControl::Draw
          (FOptionMenuItemControl *this,FOptionMenuDescriptor *desc,int y,int indent,bool selected)

{
  FKeyBindings *this_00;
  char *cmd;
  EColorRange local_88;
  EColorRange local_84;
  int local_70;
  int local_6c;
  int Key2;
  int Key1;
  char description [64];
  bool selected_local;
  int indent_local;
  int y_local;
  FOptionMenuDescriptor *desc_local;
  FOptionMenuItemControl *this_local;
  
  if ((this->mWaiting & 1U) == 0) {
    if (selected) {
      local_88 = OptionSettings.mFontColorSelection;
    }
    else {
      local_88 = OptionSettings.mFontColor;
    }
    local_84 = local_88;
  }
  else {
    local_84 = OptionSettings.mFontColorHighlight;
  }
  description[0x3f] = selected;
  FOptionMenuItem::drawLabel(&this->super_FOptionMenuItem,indent,y,local_84,false);
  this_00 = this->mBindings;
  cmd = FName::operator_cast_to_char_(&(this->super_FOptionMenuItem).super_FListMenuItem.mAction);
  FKeyBindings::GetKeysForCommand(this_00,cmd,&local_6c,&local_70);
  C_NameKeys((char *)&Key2,local_6c,local_70);
  if ((char)Key2 == '\0') {
    DCanvas::DrawText((DCanvas *)screen,SmallFont,0xc,indent + CleanXfac_1 * 0xe,
                      y + (OptionSettings.mLinespacing + -8) * CleanYfac_1,"---",0x40001394,1,0);
  }
  else {
    M_DrawConText(9,indent + CleanXfac_1 * 0xe,y + (OptionSettings.mLinespacing + -8) * CleanYfac_1,
                  (char *)&Key2);
  }
  return indent;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		drawLabel(indent, y, mWaiting? OptionSettings.mFontColorHighlight: 
			(selected? OptionSettings.mFontColorSelection : OptionSettings.mFontColor));

		char description[64];
		int Key1, Key2;

		mBindings->GetKeysForCommand(mAction, &Key1, &Key2);
		C_NameKeys (description, Key1, Key2);
		if (description[0])
		{
			M_DrawConText(CR_WHITE, indent + CURSORSPACE, y + (OptionSettings.mLinespacing-8)*CleanYfac_1, description);
		}
		else
		{
			screen->DrawText(SmallFont, CR_BLACK, indent + CURSORSPACE, y + (OptionSettings.mLinespacing-8)*CleanYfac_1, "---",
				DTA_CleanNoMove_1, true, TAG_DONE);
		}
		return indent;
	}